

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<chrono::ChFseqNode>
          (ChArchiveIn *this,
          ChNameValue<std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>_>
          *bVal)

{
  ulong uVar1;
  size_t arraysize;
  char idname [20];
  ChFseqNode element;
  ulong local_b8;
  ChNameValue<chrono::ChFseqNode> local_b0;
  char local_98 [24];
  ChFseqNode local_80;
  
  std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>::clear(bVal->_value);
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_b8);
  for (uVar1 = 0; uVar1 < local_b8; uVar1 = uVar1 + 1) {
    sprintf(local_98,"%lu",uVar1);
    ChFseqNode::ChFseqNode(&local_80);
    local_b0._flags = '\0';
    local_b0._name = local_98;
    local_b0._value = &local_80;
    in<chrono::ChFseqNode>(this,&local_b0);
    std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>::push_back
              (bVal->_value,&local_80);
    (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.fx.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::list<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value().push_back(element);
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }